

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O1

Saig_Tsim_t * Saig_TsiStart(Aig_Man_t *pAig)

{
  uint uVar1;
  uint uVar2;
  Saig_Tsim_t *pSVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Aig_MmFixed_t *pAVar6;
  uint **__s;
  uint uVar7;
  int iVar8;
  
  pSVar3 = (Saig_Tsim_t *)malloc(0x48);
  pSVar3->pAig = (Aig_Man_t *)0x0;
  *(undefined8 *)&pSVar3->nWords = 0;
  pSVar3->vStates = (Vec_Ptr_t *)0x0;
  pSVar3->pMem = (Aig_MmFixed_t *)0x0;
  pSVar3->nPrefix = 0;
  pSVar3->nCycle = 0;
  *(undefined8 *)&pSVar3->nNonXRegs = 0;
  pSVar3->vNonXRegs = (Vec_Int_t *)0x0;
  pSVar3->pBins = (uint **)0x0;
  *(undefined8 *)&pSVar3->nBins = 0;
  pSVar3->pAig = pAig;
  iVar8 = ((pAig->nRegs >> 4) + 1) - (uint)((pAig->nRegs & 0xfU) == 0);
  pSVar3->nWords = iVar8;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(8000);
  pVVar4->pArray = ppvVar5;
  pSVar3->vStates = pVVar4;
  pAVar6 = Aig_MmFixedStart(iVar8 * 4 + 8,10000);
  pSVar3->pMem = pAVar6;
  uVar7 = 4999;
  while( true ) {
    do {
      uVar1 = uVar7 + 1;
      uVar2 = uVar7 & 1;
      uVar7 = uVar1;
    } while (uVar2 != 0);
    if (uVar1 < 9) break;
    iVar8 = 5;
    while (uVar1 % (iVar8 - 2U) != 0) {
      uVar2 = iVar8 * iVar8;
      iVar8 = iVar8 + 2;
      if (uVar1 < uVar2) goto LAB_006e4e14;
    }
  }
LAB_006e4e14:
  pSVar3->nBins = uVar1;
  __s = (uint **)malloc((long)(int)uVar1 << 3);
  pSVar3->pBins = __s;
  memset(__s,0,(long)(int)uVar1 << 3);
  return pSVar3;
}

Assistant:

Saig_Tsim_t * Saig_TsiStart( Aig_Man_t * pAig )
{
    Saig_Tsim_t * p;
    p = (Saig_Tsim_t *)ABC_ALLOC( char, sizeof(Saig_Tsim_t) );
    memset( p, 0, sizeof(Saig_Tsim_t) );
    p->pAig    = pAig;
    p->nWords  = Abc_BitWordNum( 2*Aig_ManRegNum(pAig) );
    p->vStates = Vec_PtrAlloc( 1000 );
    p->pMem    = Aig_MmFixedStart( sizeof(unsigned) * p->nWords + sizeof(unsigned *), 10000 );
    p->nBins   = Abc_PrimeCudd(TSIM_MAX_ROUNDS/2);
    p->pBins   = ABC_ALLOC( unsigned *, p->nBins );
    memset( p->pBins, 0, sizeof(unsigned *) * p->nBins );
    return p;
}